

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader::data__common_float_or_param_type____float
          (LibraryEffectsLoader *this,float value)

{
  EffectCommon *pEVar1;
  FloatOrParam FStack_a8;
  
  switch(this->mCurrentShaderParameterType) {
  case SHADER_PARAMETER_SHININESS:
    pEVar1 = (this->mCurrentEffect->mCommonEffects).
             super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mData
             [(this->mCurrentEffect->mCommonEffects).
              super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mCount - 1];
    COLLADAFW::FloatOrParam::FloatOrParam(&FStack_a8,value);
    COLLADAFW::FloatOrParam::operator=(&pEVar1->mShininess,&FStack_a8);
    break;
  default:
    goto switchD_007dceda_caseD_5;
  case SHADER_PARAMETER_REFLECTIVITY:
    pEVar1 = (this->mCurrentEffect->mCommonEffects).
             super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mData
             [(this->mCurrentEffect->mCommonEffects).
              super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mCount - 1];
    COLLADAFW::FloatOrParam::FloatOrParam(&FStack_a8,value);
    COLLADAFW::FloatOrParam::operator=(&pEVar1->mReflectivity,&FStack_a8);
    break;
  case SHADER_PARAMETER_TRANSPARENCY:
    (this->mTransparency).mFloatValue = value;
    return true;
  case SHADER_PARAMETER_INDEX_OF_REFRACTION:
    pEVar1 = (this->mCurrentEffect->mCommonEffects).
             super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mData
             [(this->mCurrentEffect->mCommonEffects).
              super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mCount - 1];
    COLLADAFW::FloatOrParam::FloatOrParam(&FStack_a8,value);
    COLLADAFW::FloatOrParam::operator=(&pEVar1->mIndexOfRefraction,&FStack_a8);
  }
  COLLADAFW::FloatOrParam::~FloatOrParam(&FStack_a8);
switchD_007dceda_caseD_5:
  return true;
}

Assistant:

bool LibraryEffectsLoader::data__common_float_or_param_type____float( float value )
	{
		switch ( mCurrentShaderParameterType)
		{
		case SHADER_PARAMETER_SHININESS:
			mCurrentEffect->getCommonEffects().back()->setShininess(value);
			break;
		case SHADER_PARAMETER_REFLECTIVITY:
			mCurrentEffect->getCommonEffects().back()->setReflectivity(value);
			break;
		case SHADER_PARAMETER_INDEX_OF_REFRACTION:
			mCurrentEffect->getCommonEffects().back()->setIndexOfRefraction(value);
			break;
		case SHADER_PARAMETER_TRANSPARENCY:
			mTransparency.setFloatValue (value);
			break;
        default:
            break;
		}
        
		return true;
	}